

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O1

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::getPointsToNodeOrNull(LLVMPointerGraphBuilder *this,Value *val)

{
  PSNode *pPVar1;
  PSNodesSeq *pPVar2;
  
  pPVar1 = PointsToMapping<const_llvm::Value_*>::get(&this->mapping,val);
  if (pPVar1 == (PSNode *)0x0) {
    pPVar2 = getNodes(this,val);
    if (pPVar2 == (PSNodesSeq *)0x0) {
      pPVar1 = (PSNode *)0x0;
    }
    else {
      pPVar1 = *(PSNode **)(pPVar2 + 0x18);
      if (pPVar1 == (PSNode *)0x0) {
        pPVar1 = *(PSNode **)(*(long *)(pPVar2 + 8) + -8);
      }
    }
  }
  return pPVar1;
}

Assistant:

PSNode *getPointsToNodeOrNull(const llvm::Value *val) {
        // if we have a mapping for this node (e.g. the original
        // node was optimized away and replaced by mapping),
        // return it
        if (auto *mp = mapping.get(val))
            return mp;
        if (auto *nds = getNodes(val)) {
            // otherwise get the representant of the built nodes
            return nds->getRepresentant();
        }

        // not built!
        return nullptr;
    }